

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t get_test_set(wchar_t *test_set,wchar_t limit,char *test)

{
  bool bVar1;
  wchar_t wVar2;
  wchar_t local_50;
  char *name;
  char *vp;
  wchar_t local_30;
  wchar_t idx;
  wchar_t end;
  wchar_t start;
  char *test_local;
  wchar_t limit_local;
  wchar_t *test_set_local;
  
  vp._4_4_ = L'\0';
  if (test == (char *)0x0) {
    for (; test_set_local._4_4_ = limit, vp._4_4_ < limit; vp._4_4_ = vp._4_4_ + L'\x01') {
      test_set[vp._4_4_] = vp._4_4_;
    }
  }
  else {
    if ((*test < '0') || ('9' < *test)) {
      for (idx = L'\0'; idx < limit; idx = idx + L'\x01') {
        wVar2 = test_filter(test,tests[idx].name);
        if (wVar2 != L'\0') {
          test_set[vp._4_4_] = idx;
          vp._4_4_ = vp._4_4_ + L'\x01';
        }
      }
    }
    else {
      idx = L'\0';
      name = test;
      while( true ) {
        bVar1 = false;
        if ('/' < *name) {
          bVar1 = *name < ':';
        }
        if (!bVar1) break;
        idx = *name + -0x30 + idx * 10;
        name = name + 1;
      }
      if (*name == '\0') {
        local_30 = idx;
      }
      else {
        if (*name != '-') {
          return L'\xffffffff';
        }
        name = name + 1;
        if (*name == '\0') {
          local_30 = limit + L'\xffffffff';
        }
        else {
          local_30 = L'\0';
          while( true ) {
            bVar1 = false;
            if ('/' < *name) {
              bVar1 = *name < ':';
            }
            if (!bVar1) break;
            local_30 = *name + -0x30 + local_30 * 10;
            name = name + 1;
          }
        }
      }
      if (((idx < L'\0') || (limit <= local_30)) || (local_30 < idx)) {
        return L'\xffffffff';
      }
      while (idx <= local_30) {
        test_set[vp._4_4_] = idx;
        vp._4_4_ = vp._4_4_ + L'\x01';
        idx = idx + L'\x01';
      }
    }
    if (vp._4_4_ == L'\0') {
      local_50 = L'\xffffffff';
    }
    else {
      local_50 = vp._4_4_;
    }
    test_set_local._4_4_ = local_50;
  }
  return test_set_local._4_4_;
}

Assistant:

static int
get_test_set(int *test_set, int limit, const char *test)
{
	int start, end;
	int idx = 0;

	if (test == NULL) {
		/* Default: Run all tests. */
		for (;idx < limit; idx++)
			test_set[idx] = idx;
		return (limit);
	}
	if (*test >= '0' && *test <= '9') {
		const char *vp = test;
		start = 0;
		while (*vp >= '0' && *vp <= '9') {
			start *= 10;
			start += *vp - '0';
			++vp;
		}
		if (*vp == '\0') {
			end = start;
		} else if (*vp == '-') {
			++vp;
			if (*vp == '\0') {
				end = limit - 1;
			} else {
				end = 0;
				while (*vp >= '0' && *vp <= '9') {
					end *= 10;
					end += *vp - '0';
					++vp;
				}
			}
		} else
			return (-1);
		if (start < 0 || end >= limit || start > end)
			return (-1);
		while (start <= end)
			test_set[idx++] = start++;
	} else {
		for (start = 0; start < limit; ++start) {
			const char *name = tests[start].name;
			if (test_filter(test, name))
				test_set[idx++] = start;
		}
	}
	return ((idx == 0)?-1:idx);
}